

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O2

ComparatorDisposer *
ApprovalTests::FileApprover::registerComparatorForExtension
          (ComparatorDisposer *__return_storage_ptr__,string *extensionWithDot,
          shared_ptr<ApprovalTests::ApprovalComparator> *comparator)

{
  __shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ::std::__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             &comparator->
              super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>);
  ComparatorFactory::registerComparator
            (__return_storage_ptr__,extensionWithDot,
             (shared_ptr<ApprovalTests::ApprovalComparator> *)&_Stack_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ComparatorDisposer FileApprover::registerComparatorForExtension(
        const std::string& extensionWithDot,
        std::shared_ptr<ApprovalComparator> comparator)
    {
        return ComparatorFactory::registerComparator(extensionWithDot, comparator);
    }